

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O1

void * lj_alloc_free(void *msp,void *ptr)

{
  int iVar1;
  ulong uVar2;
  long *__addr;
  uint uVar3;
  bool bVar4;
  int iVar5;
  void *in_RAX;
  ulong *puVar6;
  void *pvVar7;
  size_t sVar8;
  int *piVar9;
  msegmentptr sp;
  long *plVar10;
  ulong *puVar11;
  uint uVar12;
  ulong *puVar13;
  ulong *puVar14;
  long *plVar15;
  ulong *puVar16;
  long lVar17;
  byte bVar18;
  long lVar19;
  ulong uVar20;
  int olderr;
  ulong uVar21;
  ulong uVar22;
  
  if (ptr == (void *)0x0) {
    return in_RAX;
  }
  puVar6 = (ulong *)((long)ptr + -0x10);
  uVar21 = *(ulong *)((long)ptr + -8) & 0xfffffffffffffffc;
  puVar16 = (ulong *)((long)ptr + uVar21);
  puVar13 = puVar16 + -2;
  uVar22 = uVar21;
  if ((*(ulong *)((long)ptr + -8) & 1) == 0) {
    uVar20 = *puVar6;
    if ((uVar20 & 1) == 0) {
      puVar6 = (ulong *)((long)puVar6 - uVar20);
      uVar22 = uVar20 + uVar21;
      if (puVar6 == *(ulong **)((long)msp + 0x18)) {
        uVar20 = puVar16[-1];
        bVar4 = true;
        if ((~(uint)uVar20 & 3) == 0) {
          *(ulong *)((long)msp + 8) = uVar22;
          puVar16[-1] = uVar20 & 0xfffffffffffffffe;
          puVar6[1] = uVar22 | 1;
          *puVar13 = uVar22;
          bVar4 = false;
        }
      }
      else {
        puVar14 = (ulong *)puVar6[3];
        if (0xff < uVar20) {
          uVar20 = puVar6[6];
          if (puVar14 == puVar6) {
            puVar14 = (ulong *)puVar6[5];
            if (puVar14 != (ulong *)0x0) {
              puVar11 = puVar6 + 5;
LAB_0014168d:
              do {
                if (puVar14[5] == 0) {
                  if (puVar14[4] == 0) goto code_r0x001416a1;
                  puVar11 = puVar14 + 4;
                }
                else {
                  puVar11 = puVar14 + 5;
                }
                puVar14 = (ulong *)*puVar11;
              } while( true );
            }
            puVar14 = (ulong *)puVar6[4];
            if (puVar14 != (ulong *)0x0) {
              puVar11 = puVar6 + 4;
              goto LAB_0014168d;
            }
            puVar14 = (ulong *)0x0;
          }
          else {
            uVar2 = puVar6[2];
            *(ulong **)(uVar2 + 0x18) = puVar14;
            puVar14[2] = uVar2;
          }
          goto LAB_001416a8;
        }
        puVar11 = (ulong *)puVar6[2];
        if (puVar11 == puVar14) {
          bVar18 = (byte)(uVar20 >> 3) & 0x1f;
          *(uint *)msp = *msp & (-2 << bVar18 | 0xfffffffeU >> 0x20 - bVar18);
        }
        else {
          puVar11[3] = (ulong)puVar14;
          puVar14[2] = (ulong)puVar11;
        }
        bVar4 = true;
      }
    }
    else {
      uVar22 = uVar21 + (uVar20 & 0xfffffffffffffffe) + 0x20;
      piVar9 = __errno_location();
      iVar1 = *piVar9;
      munmap((void *)((long)puVar6 - (uVar20 & 0xfffffffffffffffe)),uVar22);
      *piVar9 = iVar1;
      bVar4 = false;
    }
    goto LAB_00141715;
  }
LAB_0014171e:
  uVar21 = *(ulong *)((long)ptr + (uVar21 - 8));
  if ((uVar21 & 2) != 0) {
    puVar16[-1] = uVar21 & 0xfffffffffffffffe;
    puVar6[1] = uVar22 | 1;
    *(ulong *)((long)puVar6 + uVar22) = uVar22;
    goto LAB_00141788;
  }
  if (puVar13 == *(ulong **)((long)msp + 0x20)) {
    uVar22 = uVar22 + *(long *)((long)msp + 0x10);
    *(ulong *)((long)msp + 0x10) = uVar22;
    *(ulong **)((long)msp + 0x20) = puVar6;
    puVar6[1] = uVar22 | 1;
    if (puVar6 == *(ulong **)((long)msp + 0x18)) {
      *(undefined8 *)((long)msp + 0x18) = 0;
      *(undefined8 *)((long)msp + 8) = 0;
    }
    if (uVar22 <= *(ulong *)((long)msp + 0x28)) {
      return puVar6;
    }
    if (uVar22 < 0x41) {
      uVar22 = 0;
      goto LAB_00141a59;
    }
    uVar22 = (uVar22 + 0x1ffbf & 0xfffffffffffe0000) - 0x20000;
    plVar10 = (long *)((long)msp + 0x348);
    plVar15 = plVar10;
    do {
      if (((ulong *)*plVar15 <= puVar6) && (puVar6 < (ulong *)(*plVar15 + plVar15[1])))
      goto LAB_00141a00;
      plVar15 = (long *)plVar15[2];
    } while (plVar15 != (long *)0x0);
    plVar15 = (long *)0x0;
LAB_00141a00:
    uVar21 = plVar15[1];
    if (uVar21 < uVar22) {
LAB_00141a0c:
      uVar22 = 0;
    }
    else {
      __addr = (long *)*plVar15;
      do {
        if (plVar10 < (long *)((long)__addr + uVar21) && __addr <= plVar10) goto LAB_00141a0c;
        plVar10 = (long *)plVar10[2];
      } while (plVar10 != (long *)0x0);
      piVar9 = __errno_location();
      iVar1 = *piVar9;
      pvVar7 = mremap(__addr,uVar21,uVar21 - uVar22,0);
      *piVar9 = iVar1;
      if (pvVar7 == (void *)0xffffffffffffffff) {
        iVar5 = munmap((void *)((uVar21 - uVar22) + *plVar15),uVar22);
        *piVar9 = iVar1;
        if (iVar5 != 0) goto LAB_00141a0c;
      }
    }
    if (uVar22 != 0) {
      plVar15[1] = plVar15[1] - uVar22;
      lVar17 = *(long *)((long)msp + 0x20);
      lVar19 = *(long *)((long)msp + 0x10) - uVar22;
      uVar21 = (ulong)(-(int)lVar17 - 0x10U & 7);
      uVar20 = lVar19 - uVar21;
      *(ulong *)((long)msp + 0x20) = lVar17 + uVar21;
      *(ulong *)((long)msp + 0x10) = uVar20;
      *(ulong *)(lVar17 + 8 + uVar21) = uVar20 | 1;
      *(undefined8 *)(lVar17 + 8 + lVar19) = 0x40;
      *(undefined8 *)((long)msp + 0x28) = 0x200000;
    }
LAB_00141a59:
    sVar8 = release_unused_segments((mstate)msp);
    if ((void *)(sVar8 + uVar22) != (void *)0x0) {
      return (void *)(sVar8 + uVar22);
    }
    pvVar7 = *(void **)((long)msp + 0x10);
    if (pvVar7 <= *(void **)((long)msp + 0x28)) {
      return pvVar7;
    }
    *(undefined8 *)((long)msp + 0x28) = 0xffffffffffffffff;
    return pvVar7;
  }
  if (puVar13 == *(ulong **)((long)msp + 0x18)) {
    uVar22 = uVar22 + *(long *)((long)msp + 8);
    *(ulong *)((long)msp + 8) = uVar22;
    *(ulong **)((long)msp + 0x18) = puVar6;
    puVar6[1] = uVar22 | 1;
    *(ulong *)((long)puVar6 + uVar22) = uVar22;
    return puVar6;
  }
  uVar22 = uVar22 + (uVar21 & 0xfffffffffffffffc);
  puVar14 = (ulong *)puVar16[1];
  if (uVar21 < 0x100) {
    puVar16 = (ulong *)*puVar16;
    if (puVar16 == puVar14) {
      bVar18 = (byte)(uVar21 >> 3) & 0x1f;
      *(uint *)msp = *msp & (-2 << bVar18 | 0xfffffffeU >> 0x20 - bVar18);
    }
    else {
      puVar16[3] = (ulong)puVar14;
      puVar14[2] = (ulong)puVar16;
    }
  }
  else {
    uVar21 = puVar16[4];
    if (puVar14 == puVar13) {
      puVar14 = (ulong *)puVar16[3];
      if (puVar14 != (ulong *)0x0) {
        puVar11 = puVar16 + 3;
LAB_00141b18:
        do {
          if (puVar14[5] == 0) {
            if (puVar14[4] == 0) goto code_r0x00141b2c;
            puVar11 = puVar14 + 4;
          }
          else {
            puVar11 = puVar14 + 5;
          }
          puVar14 = (ulong *)*puVar11;
        } while( true );
      }
      puVar14 = (ulong *)puVar16[2];
      if (puVar14 != (ulong *)0x0) {
        puVar11 = puVar16 + 2;
        goto LAB_00141b18;
      }
      puVar14 = (ulong *)0x0;
    }
    else {
      uVar20 = *puVar16;
      *(ulong **)(uVar20 + 0x18) = puVar14;
      puVar14[2] = uVar20;
    }
LAB_00141b33:
    if (uVar21 != 0) {
      uVar20 = puVar16[5];
      if (puVar13 == *(ulong **)((long)msp + uVar20 * 8 + 0x248)) {
        *(ulong **)((long)msp + uVar20 * 8 + 0x248) = puVar14;
        if (puVar14 == (ulong *)0x0) {
          bVar18 = (byte)uVar20 & 0x1f;
          *(uint *)((long)msp + 4) =
               *(uint *)((long)msp + 4) & (-2 << bVar18 | 0xfffffffeU >> 0x20 - bVar18);
          goto LAB_00141b6f;
        }
      }
      else {
        if (*(ulong **)(uVar21 + 0x20) == puVar13) {
          *(ulong **)(uVar21 + 0x20) = puVar14;
        }
        else {
          *(ulong **)(uVar21 + 0x28) = puVar14;
        }
LAB_00141b6f:
        if (puVar14 == (ulong *)0x0) goto LAB_00141b9a;
      }
      puVar14[6] = uVar21;
      uVar21 = puVar16[2];
      if (uVar21 != 0) {
        puVar14[4] = uVar21;
        *(ulong **)(uVar21 + 0x30) = puVar14;
      }
      uVar21 = puVar16[3];
      if (uVar21 != 0) {
        puVar14[5] = uVar21;
        *(ulong **)(uVar21 + 0x30) = puVar14;
      }
    }
  }
LAB_00141b9a:
  puVar6[1] = uVar22 | 1;
  *(ulong *)((long)puVar6 + uVar22) = uVar22;
  if (puVar6 == *(ulong **)((long)msp + 0x18)) {
    *(ulong *)((long)msp + 8) = uVar22;
    return puVar6;
  }
LAB_00141788:
  if (uVar22 < 0x100) {
    uVar22 = uVar22 >> 3;
    uVar21 = (long)msp + uVar22 * 0x10 + 0x38;
    if ((*msp >> ((uint)uVar22 & 0x1f) & 1) == 0) {
      *(uint *)msp = *msp | 1 << ((byte)uVar22 & 0x1f);
      uVar20 = uVar21;
    }
    else {
      uVar20 = *(ulong *)((long)msp + uVar22 * 0x10 + 0x48);
    }
    *(ulong **)((long)msp + uVar22 * 0x10 + 0x48) = puVar6;
    *(ulong **)(uVar20 + 0x18) = puVar6;
    puVar6[2] = uVar20;
    puVar6[3] = uVar21;
  }
  else {
    uVar12 = (uint)(uVar22 >> 8);
    if (uVar12 == 0) {
      uVar21 = 0;
    }
    else {
      uVar21 = 0x1f;
      if (uVar12 < 0x10000) {
        uVar3 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar21 = (ulong)((uint)((uVar22 >> ((ulong)(byte)(0x26 - (char)(uVar3 ^ 0x1f)) & 0x3f) & 1)
                               != 0) | (uVar3 ^ 0x1f) * 2 ^ 0x3e);
      }
    }
    puVar16 = (ulong *)((long)msp + uVar21 * 8 + 0x248);
    puVar6[7] = uVar21;
    puVar6[4] = 0;
    puVar6[5] = 0;
    if ((*(uint *)((long)msp + 4) >> ((uint)uVar21 & 0x1f) & 1) == 0) {
      *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar21 & 0x1f);
      lVar17 = 0x10;
      lVar19 = 0x30;
      puVar13 = puVar6;
      puVar14 = puVar16;
      puVar11 = puVar6;
LAB_00141984:
      *puVar16 = (ulong)puVar6;
      *(ulong **)((long)puVar6 + lVar19) = puVar14;
      puVar6[3] = (ulong)puVar13;
      *(ulong **)((long)puVar6 + lVar17) = puVar11;
    }
    else {
      puVar13 = (ulong *)*puVar16;
      bVar18 = 0x39 - (char)(uVar21 >> 1);
      if (uVar21 == 0x1f) {
        bVar18 = 0;
      }
      lVar17 = uVar22 << (bVar18 & 0x3f);
      do {
        if ((puVar13[1] & 0xfffffffffffffffc) == uVar22) {
          puVar16 = puVar13 + 2;
          puVar14 = (ulong *)puVar13[2];
          puVar14[3] = (ulong)puVar6;
          lVar17 = 0x30;
          lVar19 = 0x10;
          puVar11 = (ulong *)0x0;
          goto LAB_00141984;
        }
        puVar16 = (ulong *)puVar13[4 - (lVar17 >> 0x3f)];
        puVar14 = puVar16;
        if (puVar16 == (ulong *)0x0) {
          puVar13[4 - (lVar17 >> 0x3f)] = (ulong)puVar6;
          puVar6[6] = (ulong)puVar13;
          puVar6[3] = (ulong)puVar6;
          puVar6[2] = (ulong)puVar6;
          puVar14 = puVar13;
        }
        puVar13 = puVar14;
        lVar17 = lVar17 * 2;
      } while (puVar16 != (ulong *)0x0);
    }
    plVar10 = (long *)((long)msp + 0x30);
    *plVar10 = *plVar10 + -1;
    if (*plVar10 == 0) {
      pvVar7 = (void *)release_unused_segments((mstate)msp);
      return pvVar7;
    }
  }
  return puVar6;
code_r0x001416a1:
  *puVar11 = 0;
LAB_001416a8:
  bVar4 = true;
  if (uVar20 != 0) {
    uVar2 = puVar6[7];
    if (puVar6 == *(ulong **)((long)msp + uVar2 * 8 + 0x248)) {
      *(ulong **)((long)msp + uVar2 * 8 + 0x248) = puVar14;
      if (puVar14 == (ulong *)0x0) {
        bVar18 = (byte)uVar2 & 0x1f;
        *(uint *)((long)msp + 4) =
             *(uint *)((long)msp + 4) & (-2 << bVar18 | 0xfffffffeU >> 0x20 - bVar18);
        goto LAB_001416ea;
      }
    }
    else {
      if (*(ulong **)(uVar20 + 0x20) == puVar6) {
        *(ulong **)(uVar20 + 0x20) = puVar14;
      }
      else {
        *(ulong **)(uVar20 + 0x28) = puVar14;
      }
LAB_001416ea:
      if (puVar14 == (ulong *)0x0) goto LAB_00141715;
    }
    puVar14[6] = uVar20;
    uVar20 = puVar6[4];
    if (uVar20 != 0) {
      puVar14[4] = uVar20;
      *(ulong **)(uVar20 + 0x30) = puVar14;
    }
    uVar20 = puVar6[5];
    if (uVar20 != 0) {
      puVar14[5] = uVar20;
      *(ulong **)(uVar20 + 0x30) = puVar14;
    }
  }
LAB_00141715:
  if (!bVar4) {
    return puVar6;
  }
  goto LAB_0014171e;
code_r0x00141b2c:
  *puVar11 = 0;
  goto LAB_00141b33;
}

Assistant:

static LJ_NOINLINE void *lj_alloc_free(void *msp, void *ptr)
{
  if (ptr != 0) {
    mchunkptr p = mem2chunk(ptr);
    mstate fm = (mstate)msp;
    size_t psize = chunksize(p);
    mchunkptr next = chunk_plus_offset(p, psize);
    if (!pinuse(p)) {
      size_t prevsize = p->prev_foot;
      if ((prevsize & IS_DIRECT_BIT) != 0) {
	prevsize &= ~IS_DIRECT_BIT;
	psize += prevsize + DIRECT_FOOT_PAD;
	CALL_MUNMAP((char *)p - prevsize, psize);
	return NULL;
      } else {
	mchunkptr prev = chunk_minus_offset(p, prevsize);
	psize += prevsize;
	p = prev;
	/* consolidate backward */
	if (p != fm->dv) {
	  unlink_chunk(fm, p, prevsize);
	} else if ((next->head & INUSE_BITS) == INUSE_BITS) {
	  fm->dvsize = psize;
	  set_free_with_pinuse(p, psize, next);
	  return NULL;
	}
      }
    }
    if (!cinuse(next)) {  /* consolidate forward */
      if (next == fm->top) {
	size_t tsize = fm->topsize += psize;
	fm->top = p;
	p->head = tsize | PINUSE_BIT;
	if (p == fm->dv) {
	  fm->dv = 0;
	  fm->dvsize = 0;
	}
	if (tsize > fm->trim_check)
	  alloc_trim(fm, 0);
	return NULL;
      } else if (next == fm->dv) {
	size_t dsize = fm->dvsize += psize;
	fm->dv = p;
	set_size_and_pinuse_of_free_chunk(p, dsize);
	return NULL;
      } else {
	size_t nsize = chunksize(next);
	psize += nsize;
	unlink_chunk(fm, next, nsize);
	set_size_and_pinuse_of_free_chunk(p, psize);
	if (p == fm->dv) {
	  fm->dvsize = psize;
	  return NULL;
	}
      }
    } else {
      set_free_with_pinuse(p, psize, next);
    }

    if (is_small(psize)) {
      insert_small_chunk(fm, p, psize);
    } else {
      tchunkptr tp = (tchunkptr)p;
      insert_large_chunk(fm, tp, psize);
      if (--fm->release_checks == 0)
	release_unused_segments(fm);
    }
  }
  return NULL;
}